

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

uint ppc_hash64_hpte_page_shift_noslb(PowerPCCPU_conflict3 *cpu,uint64_t pte0,uint64_t pte1)

{
  uint uVar1;
  PPCHash64SegmentPageSizes *sps_00;
  uint shift;
  PPCHash64SegmentPageSizes *sps;
  int i;
  uint64_t pte1_local;
  uint64_t pte0_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  if ((pte0 & 4) == 0) {
    cpu_local._4_4_ = 0xc;
  }
  else {
    sps._4_4_ = 0;
    while ((sps._4_4_ < 8 && (sps_00 = cpu->hash64_opts->sps + sps._4_4_, sps_00->page_shift != 0)))
    {
      uVar1 = hpte_page_shift(sps_00,pte0,pte1);
      if (uVar1 != 0) {
        return uVar1;
      }
      sps._4_4_ = sps._4_4_ + 1;
    }
    cpu_local._4_4_ = 0;
  }
  return cpu_local._4_4_;
}

Assistant:

unsigned ppc_hash64_hpte_page_shift_noslb(PowerPCCPU *cpu,
                                          uint64_t pte0, uint64_t pte1)
{
    int i;

    if (!(pte0 & HPTE64_V_LARGE)) {
        return 12;
    }

    /*
     * The encodings in env->sps need to be carefully chosen so that
     * this gives an unambiguous result.
     */
    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps = &cpu->hash64_opts->sps[i];
        unsigned shift;

        if (!sps->page_shift) {
            break;
        }

        shift = hpte_page_shift(sps, pte0, pte1);
        if (shift) {
            return shift;
        }
    }

    return 0;
}